

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Object * __thiscall ICM::Interpreter::run(Interpreter *this)

{
  undefined1 uVar1;
  Instruction IVar2;
  pointer ppIVar3;
  long *plVar4;
  long *plVar5;
  ElementPool *EP;
  TypeUnit TVar6;
  Element *pEVar7;
  bool bVar8;
  element_type *ppOVar9;
  time_t tVar10;
  long lVar11;
  Object *pOVar12;
  string *psVar13;
  InstructionData *pIVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar15;
  uint __flags;
  long lVar16;
  ulong uVar17;
  InstructionData *pIVar18;
  InstructionData *extraout_RDX;
  InstructionData *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  Inc *inst;
  char *in_RSI;
  ulong uVar19;
  void *in_R8;
  Element *e;
  Element *pEVar20;
  long lVar21;
  Object OVar22;
  lightlist_creater<ICM::Object_*> llc;
  DataList v;
  allocator_type local_89;
  undefined1 local_88 [32];
  Object *local_68;
  DataList local_60;
  InstructionData local_48;
  long local_38;
  
  tVar10 = time((time_t *)0x0);
  srand((uint)tVar10);
  lVar21 = 0;
  do {
    ppIVar3 = (this->InstList->
              super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              ).
              super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pIVar14 = ppIVar3[lVar21];
    IVar2 = pIVar14->Inst;
    if (0x24 < IVar2 - end) {
      if (IVar2 == rest) {
        pOVar12 = getObject(this,(Element *)((long)(pIVar14 + 1) + 8));
        in_RSI = (char *)(ulong)*(uint *)&pIVar14->field_0xc;
        pIVar18 = (InstructionData *)((DAT_00153800 - DAT_001537f8 >> 3) * -0x5555555555555555);
        if (pIVar18 < in_RSI || (long)pIVar18 - (long)in_RSI == 0) goto LAB_001280e5;
        lVar11 = **(long **)(DAT_001537f8 + 0x10 + (long)in_RSI * 0x18);
        lVar16 = (ulong)*(uint *)&pIVar14[1]._vptr_InstructionData * 0x20;
        if (*(int *)(lVar11 + lVar16) != 4) {
          __assert_fail("getFromIdentTable(ident_index).type == I_DyVarb",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/include/temp-getelement2.h"
                        ,0x2a,"void ICM::setDyVarbRestType(const IdentIndex &, TypeUnit)");
        }
        *(undefined8 *)(lVar11 + lVar16 + 0x10) = *pOVar12->data;
      }
      goto switchD_00127936_caseD_5;
    }
    iVar15 = (&switchD_00127936::switchdataD_00141b90)[IVar2 - end] + 0x141b90;
    switch(IVar2) {
    case end:
      local_68 = this->Result;
      lVar11 = 1;
      goto LAB_001280c9;
    case sing:
      pOVar12 = this->Result;
      goto LAB_00127e23;
    case stor:
      in_RSI = (char *)(pIVar14 + 1);
      pOVar12 = getObject(this,(Element *)in_RSI);
      goto LAB_00127e23;
    case list:
      pIVar18 = *(InstructionData **)((long)(pIVar14 + 1) + 8);
      local_88._0_8_ = (InstructionData *)pIVar14[1]._vptr_InstructionData;
      if (pIVar18 <= (InstructionData *)pIVar14[1]._vptr_InstructionData) {
        local_88._0_8_ = pIVar18;
      }
      local_88._8_8_ = pIVar18;
      createDataList(&local_60,this,
                     (RangeIterator<__gnu_cxx::__normal_iterator<ICM::Instruction::Element_*,_std::vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>_>_>
                      *)local_88);
      local_88._0_8_ = (InstructionData *)0x0;
      local_88._8_8_ = local_60._capacity;
      pIVar14 = (InstructionData *)malloc(local_60._capacity << 3);
      local_88._16_8_ = pIVar14;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<ICM::Object**,void(*)(ICM::Object**),std::allocator<void>,void>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x18),pIVar14,
                 Common::Memory::free<ICM::Object*>);
      ppOVar9 = local_60._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((Element *)local_60._capacity != (Element *)0x0) {
        lVar16 = local_60._capacity << 3;
        lVar11 = 0;
        __child_stack = extraout_RDX;
        do {
          iVar15 = Object::clone(*(Object **)((long)ppOVar9 + lVar11),(__fn *)pIVar14,__child_stack,
                                 (int)pIVar18,in_R8);
          pIVar14 = (InstructionData *)
                    ((long)&((anon_union_4_2_4727c1b0_for_Element_0 *)local_88._0_8_)->type + 1);
          *(ulong *)(local_88._16_8_ + local_88._0_8_ * 8) = CONCAT44(extraout_var,iVar15);
          lVar11 = lVar11 + 8;
          pIVar18 = (InstructionData *)local_88._0_8_;
          __child_stack = (InstructionData *)local_88._16_8_;
          local_88._0_8_ = pIVar14;
        } while (lVar16 != lVar11);
      }
      pOVar12 = (Object *)operator_new(0x10);
      in_RSI = (char *)&local_48;
      std::vector<ICM::Object*,std::allocator<ICM::Object*>>::vector<ICM::Object*const*,void>
                ((vector<ICM::Object*,std::allocator<ICM::Object*>> *)in_RSI,
                 (Object **)local_88._16_8_,(Object **)(local_88._16_8_ + local_88._8_8_ * 8),
                 &local_89);
      Objects::DataObject<(ICM::DefaultType)17>::DataObject
                ((DataObject<(ICM::DefaultType)17> *)pOVar12,(T *)in_RSI);
      (this->TempResult).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar21] = pOVar12;
      if (local_48._vptr_InstructionData != (_func_int **)0x0) {
        in_RSI = (char *)(local_38 - (long)local_48._vptr_InstructionData);
        operator_delete(local_48._vptr_InstructionData,(ulong)in_RSI);
      }
      this->Result = (this->TempResult).
                     super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar21];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._24_8_);
      }
      if (local_60._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      break;
    case pti:
      pEVar7 = *(Element **)((long)(pIVar14 + 1) + 8);
      for (pEVar20 = (Element *)pIVar14[1]._vptr_InstructionData; pEVar20 != pEVar7;
          pEVar20 = pEVar20 + 1) {
        if (((pEVar20->field_0).field_0.etype == '\x03') &&
           ((pEVar20->field_0).field_0.stype == '\x04')) {
          psVar13 = getIdentName_abi_cxx11_(pEVar20);
          printf("%s",(psVar13->_M_dataplus)._M_p);
          putchar(0x28);
        }
        pOVar12 = getObject(this,pEVar20);
        if (pOVar12 == (Object *)0x0) {
          in_RSI = "Null";
          printf("%s");
        }
        else {
          pOVar12 = getObject(this,pEVar20);
          Object::to_string_abi_cxx11_((string *)local_88,pOVar12);
          in_RSI = (char *)local_88._0_8_;
          printf("%s");
          if ((InstructionData *)local_88._0_8_ != (InstructionData *)(local_88 + 0x10)) {
            in_RSI = (char *)(local_88._16_8_ + 1);
            operator_delete((void *)local_88._0_8_,(ulong)in_RSI);
          }
        }
        if (((pEVar20->field_0).field_0.etype == '\x03') &&
           ((pEVar20->field_0).field_0.stype == '\x04')) {
          putchar(0x29);
        }
        putchar(10);
      }
      break;
    case ccal:
      in_RSI = (char *)(pIVar14 + 1);
      pOVar12 = CheckCall(this,(vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>
                                *)in_RSI);
      goto LAB_00127e23;
    case let:
    case cpy:
    case ref:
      uVar1 = *(undefined1 *)((long)(pIVar14 + 1) + 8);
      __flags = (uint)(byte)uVar1;
      if (uVar1 == sing) {
        uVar19 = (ulong)*(uint *)&pIVar14->field_0xc;
        uVar17 = (DAT_00153800 - DAT_001537f8 >> 3) * -0x5555555555555555;
        if (uVar17 < uVar19 || uVar17 - uVar19 == 0) goto LAB_001280e5;
        lVar11 = **(long **)(DAT_001537f8 + 0x10 + uVar19 * 0x18);
        lVar16 = (ulong)*(uint *)&pIVar14[1]._vptr_InstructionData * 0x20;
        if (*(int *)(lVar11 + lVar16) != 4) goto LAB_00128112;
        in_RSI = (char *)(this->TempResult).
                         super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
        lVar11 = lVar11 + lVar16;
        lVar16 = *(long *)(lVar11 + 0x10);
        if ((lVar16 == 3) ||
           (lVar16 == **(long **)((anon_union_4_2_4727c1b0_for_Element_0 *)
                                  &((InstructionData *)in_RSI)->_vptr_InstructionData +
                                 (long)pIVar14[2]._vptr_InstructionData * 2))) {
          *(long **)(lVar11 + 0x18) =
               *(long **)((anon_union_4_2_4727c1b0_for_Element_0 *)
                          &((InstructionData *)in_RSI)->_vptr_InstructionData +
                         (long)pIVar14[2]._vptr_InstructionData * 2);
          break;
        }
LAB_001280a5:
        in_RSI = "Error in set DyVarb for different type.";
        printf("%s");
        putchar(10);
      }
      else {
        pEVar20 = (Element *)((long)(pIVar14 + 1) + 8);
        if (uVar1 == end) {
          EP = this->EP;
          pOVar12 = (Object *)operator_new(0x10);
          OVar22 = getLiteral(pEVar20,EP);
          *pOVar12 = OVar22;
          in_RSI = (char *)(ulong)*(uint *)&pIVar14->field_0xc;
          pIVar18 = (InstructionData *)((DAT_00153800 - DAT_001537f8 >> 3) * -0x5555555555555555);
          if (pIVar18 < in_RSI || (long)pIVar18 - (long)in_RSI == 0) goto LAB_001280e5;
          lVar11 = **(long **)(DAT_001537f8 + 0x10 + (long)in_RSI * 0x18);
          lVar16 = (ulong)*(uint *)&pIVar14[1]._vptr_InstructionData * 0x20;
          if (*(int *)(lVar11 + lVar16) != 4) goto LAB_00128112;
          lVar11 = lVar11 + lVar16;
          TVar6 = *(TypeUnit *)(lVar11 + 0x10);
          if ((TVar6 != 3) && (TVar6 != OVar22.type)) goto LAB_001280a5;
          *(Object **)(lVar11 + 0x18) = pOVar12;
        }
        else {
          if ((uVar1 == stor) && (*(byte *)((long)(pIVar14 + 1) + 9) == 4)) {
            if (IVar2 == ref) {
              pOVar12 = getDyVarbData(pEVar20);
            }
            else {
              if (IVar2 != cpy) {
                if (IVar2 == let) {
                  pOVar12 = getDyVarbData(pEVar20);
                  goto LAB_00127f94;
                }
                break;
              }
              pOVar12 = getDyVarbData(pEVar20);
              iVar15 = Object::clone(pOVar12,(__fn *)in_RSI,__child_stack_01,__flags,in_R8);
              pOVar12 = (Object *)CONCAT44(extraout_var_01,iVar15);
            }
            in_RSI = (char *)(ulong)*(uint *)&pIVar14->field_0xc;
            pIVar18 = (InstructionData *)((DAT_00153800 - DAT_001537f8 >> 3) * -0x5555555555555555);
            if (pIVar18 < in_RSI || (long)pIVar18 - (long)in_RSI == 0) {
LAB_001280e5:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            lVar11 = **(long **)(DAT_001537f8 + 0x10 + (long)in_RSI * 0x18);
            lVar16 = (ulong)*(uint *)&pIVar14[1]._vptr_InstructionData * 0x20;
            if (*(int *)(lVar11 + lVar16) != 4) {
LAB_00128112:
              __assert_fail("getFromIdentTable(ident_index).type == I_DyVarb",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/include/temp-getelement2.h"
                            ,0x15,"void ICM::setDyVarbData(const IdentIndex &, Object *)");
            }
            lVar11 = lVar11 + lVar16;
            TVar6 = *(TypeUnit *)(lVar11 + 0x10);
          }
          else {
            if (uVar1 != stor) {
              in_RSI = "Error in Assign.";
              printf("%s");
              putchar(10);
              break;
            }
            pOVar12 = getIdentData(pEVar20);
LAB_00127f94:
            in_RSI = (char *)(ulong)*(uint *)&pIVar14->field_0xc;
            pIVar18 = (InstructionData *)((DAT_00153800 - DAT_001537f8 >> 3) * -0x5555555555555555);
            if (pIVar18 < in_RSI || (long)pIVar18 - (long)in_RSI == 0) goto LAB_001280e5;
            lVar11 = **(long **)(DAT_001537f8 + 0x10 + (long)in_RSI * 0x18);
            lVar16 = (ulong)*(uint *)&pIVar14[1]._vptr_InstructionData * 0x20;
            if (*(int *)(lVar11 + lVar16) != 4) goto LAB_00128112;
            lVar11 = lVar11 + lVar16;
            TVar6 = *(TypeUnit *)(lVar11 + 0x10);
          }
          if ((TVar6 != 3) && (TVar6 != pOVar12->type)) goto LAB_001280a5;
          *(Object **)(lVar11 + 0x18) = pOVar12;
        }
      }
      break;
    case cpys:
      in_RSI = (char *)(pIVar14 + 1);
      pOVar12 = getObject(this,(Element *)in_RSI);
      iVar15 = Object::clone(pOVar12,(__fn *)in_RSI,__child_stack_00,iVar15,in_R8);
      pOVar12 = (Object *)CONCAT44(extraout_var_00,iVar15);
LAB_00127e23:
      (this->TempResult).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar21] = pOVar12;
      this->Result = (this->TempResult).
                     super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar21];
      break;
    case inc:
      in_RSI = (char *)(ulong)*(uint *)&pIVar14->field_0xc;
      pIVar18 = (InstructionData *)((DAT_00153800 - DAT_001537f8 >> 3) * -0x5555555555555555);
      if (pIVar18 < in_RSI || (long)pIVar18 - (long)in_RSI == 0) goto LAB_001280e5;
      lVar11 = **(long **)(DAT_001537f8 + 0x10 + (long)in_RSI * 0x18);
      lVar16 = (ulong)*(uint *)&pIVar14[1]._vptr_InstructionData * 0x20;
      if (*(int *)(lVar11 + lVar16) != 4) {
LAB_001280f3:
        __assert_fail("getFromIdentTable(ident_index).type == I_DyVarb",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/include/temp-getelement2.h"
                      ,0x24,"Object *ICM::getDyVarbData(const IdentIndex &)");
      }
      plVar4 = *(long **)(*(long *)(lVar11 + lVar16 + 0x18) + 8);
      *plVar4 = *plVar4 + 1;
      break;
    case jump:
      lVar21 = (long)pIVar14[1]._vptr_InstructionData;
      lVar11 = 0;
      goto LAB_001280c9;
    case jmpf:
    case jmpn:
      in_RSI = (char *)(pIVar14 + 1);
      pOVar12 = getObject(this,(Element *)in_RSI);
      if (pOVar12->type == 6) {
        if (((ppIVar3[lVar21]->Inst == jmpf & *pOVar12->data) == 0) &&
           (ppIVar3[lVar21]->Inst != jmpn || (*pOVar12->data & 1) != 0)) {
          lVar11 = 4;
          bVar8 = true;
        }
        else {
          lVar21 = (long)pIVar14[2]._vptr_InstructionData;
          lVar11 = 0;
          bVar8 = false;
        }
      }
      else {
        bVar8 = false;
        in_RSI = "Error Not Boolean";
        printf("%s");
        putchar(10);
        lVar11 = 1;
        local_68 = (Object *)0x0;
      }
      if (bVar8) break;
      goto LAB_001280c9;
    case jpsm:
    case jpse:
    case jpla:
    case jple:
      uVar19 = (ulong)*(uint *)&pIVar14->field_0xc;
      uVar17 = (DAT_00153800 - DAT_001537f8 >> 3) * -0x5555555555555555;
      if (uVar17 < uVar19 || uVar17 - uVar19 == 0) goto LAB_001280e5;
      lVar11 = **(long **)(DAT_001537f8 + 0x10 + uVar19 * 0x18);
      lVar16 = (ulong)*(uint *)&pIVar14[1]._vptr_InstructionData * 0x20;
      if (*(int *)(lVar11 + lVar16) != 4) goto LAB_001280f3;
      plVar4 = *(long **)(*(long *)(lVar11 + lVar16 + 0x18) + 8);
      in_RSI = (char *)((long)(pIVar14 + 1) + 8);
      pOVar12 = getObject(this,(Element *)in_RSI);
      if (ppIVar3[lVar21]->Inst - jpsm < 4) {
        plVar5 = (long *)pOVar12->data;
        switch(ppIVar3[lVar21]->Inst) {
        case jpsm:
          bVar8 = *plVar4 < *plVar5;
          break;
        case jpse:
          bVar8 = *plVar4 <= *plVar5;
          break;
        case jpla:
          bVar8 = *plVar5 < *plVar4;
          break;
        case jple:
          bVar8 = *plVar5 <= *plVar4;
        }
      }
      else {
        bVar8 = false;
      }
      if (!bVar8) break;
      lVar21 = *(long *)((long)(pIVar14 + 2) + 8);
      lVar11 = 0;
      goto LAB_001280c9;
    }
switchD_00127936_caseD_5:
    lVar21 = lVar21 + 1;
    lVar11 = 0;
LAB_001280c9:
    if (lVar11 != 0) {
      return local_68;
    }
  } while( true );
}

Assistant:

Object* run() {
			size_t ProgramCounter = 0;
			std::srand(static_cast<unsigned>(std::time(0)));
			while (true) {
				using namespace Instruction;
				auto &Inst = InstList[ProgramCounter];
				//println(ProgramCounter, "| ", Inst->to_string());
				switch (Inst->inst()) {
				case ccal: {
					Insts::CheckCall &inst = static_cast<Insts::CheckCall&>(*Inst);
					TempResult[ProgramCounter] = CheckCall(inst.Data);
					Result = TempResult[ProgramCounter];
					break;
				}
						   /*case farg: {
						   Insts::FuncArgs &inst = static_cast<Insts::FuncArgs&>(*Inst);
						   Global.Func.Args = createDataList(inst.Args);
						   break;
						   }
						   case fargl: {
						   Insts::FuncArgsLight &inst = *static_cast<Insts::FuncArgsLight*>(Inst);
						   Global.Func.Args = inst.Args;
						   break;
						   }
						   case fargv: {
						   break;
						   }
						   case fsub: {
						   Insts::FuncSub &inst = static_cast<Insts::FuncSub&>(*Inst);
						   auto &args = Global.Func.Args;
						   auto &ftu = GlobalFunctionTable[inst.Func.index];
						   size_t id = getCallID(ftu, args);
						   if (id != ftu.size()) {
						   Global.Func.Func.index = inst.Func.index;
						   Global.Func.Func.subid = id;
						   }
						   else {
						   println("Error Unfind args match function ", ftu.getName(), ".");
						   Global.Func.Func.index = 0;
						   Global.Func.Func.subid = 0;
						   }
						   break;
						   }
						   case fsubr: {
						   break;
						   }
						   case fsubv: {
						   break;
						   }
						   case fcal: {
						   auto &args = Global.Func.Args;
						   auto &func = Global.Func.Func;
						   if (func.index == 0) {
						   println("Call Error");
						   return Result;
						   }
						   ObjectPtr &&op = GlobalFunctionTable[func.index][func.subid].call(args);
						   TempResult[ProgramCounter] = op.get();
						   Result = TempResult[ProgramCounter];
						   break;
						   }*/
				case let:
				case cpy:
				case ref: {
					Insts::Assign &inst = static_cast<Insts::Assign&>(*Inst);
					if (inst.Data.isLiteral()) {
						setDyVarbData(inst.VTU, createObjectFromLiteral(inst.Data, EP));
					}
					else if (inst.Data.isRefer()) {
						setDyVarbData(inst.VTU, TempResult[inst.Data.getRefer()]);
					}
					else if (inst.Data.isIdentType(I_DyVarb)) {
						switch (Inst->inst()) {
						case let:
							setDyVarbData(inst.VTU, getDyVarbData(inst.Data));
							break;
						case cpy:
							setDyVarbData(inst.VTU, getDyVarbData(inst.Data)->clone());
							break;
						case ref:
							setDyVarbData(inst.VTU, getDyVarbData(inst.Data)); // TODO
							break;
						}
					}
					else if (inst.Data.isIdent()) {
						setDyVarbData(inst.VTU, getIdentData(inst.Data));
					}
					else
						println("Error in Assign.");
					break;
				}
				case dim: {
					Insts::Assign &inst = static_cast<Insts::Assign&>(*Inst);
					break;
				}
				case rest: {
					Insts::Assign &inst = static_cast<Insts::Assign&>(*Inst);
					//(restrict a (type 5))
					Object *data = getObject(inst.Data);
					setDyVarbRestType(inst.VTU, data->dat<T_Type>().get());
					break;
				}
				case cpys: {
					Insts::CopySingle &inst = static_cast<Insts::CopySingle&>(*Inst);
					TempResult[ProgramCounter] = getObject(inst.Data)->clone(); // TODO
					Result = TempResult[ProgramCounter];
					break;
				}
				case stor: {
					Insts::Store &inst = static_cast<Insts::Store&>(*Inst);
					TempResult[ProgramCounter] = getObject(inst.Data); // TODO
					Result = TempResult[ProgramCounter];
					break;
				}
				case sing: {
					TempResult[ProgramCounter] = Result;
					Result = TempResult[ProgramCounter];
					break;
				}
				case jump: {
					Insts::Jump &inst = static_cast<Insts::Jump&>(*Inst);
					ProgramCounter = inst.Index;
					continue;
				}
				case jmpf:
				case jmpn: {
					Insts::JumpNot &inst = static_cast<Insts::JumpNot&>(*Inst);
					Object *op = getObject(inst.Data);
					if (op->isType(T_Boolean)) {
						bool r = op->dat<T_Boolean>();
						if ((Inst->inst() == jmpf && r) || (Inst->inst() == jmpn && !r)) {
							ProgramCounter = inst.Index;
							continue;
						}
					}
					else {
						println("Error Not Boolean");
						return nullptr;
					}
					break;
				}
				case inc: {
					Insts::Inc &inst = static_cast<Insts::Inc&>(*Inst);
					getDyVarbData(inst.VTU)->dat<T_Number>() += 1;
					break;
				}
				case jpsm:
				case jpse:
				case jpla:
				case jple: {
					Insts::JumpCompare &inst = static_cast<Insts::JumpCompare&>(*Inst);
					const auto &n1 = getDyVarbData(inst.VTU)->dat<T_Number>();
					const auto &n2 = getObject(inst.Data)->dat<T_Number>();
					bool r;
					switch (Inst->inst()) {
					case jpsm: r = n1 < n2; break;
					case jpse: r = n1 <= n2; break;
					case jpla: r = n1 > n2; break;
					case jple: r = n1 >= n2; break;
					default:   r = false;
					}
					if (r) {
						ProgramCounter = inst.Index;
						continue;
					}
					break;
				}
				case list: {
					Insts::List &inst = static_cast<Insts::List&>(*Inst);
					// TODO
					auto v = createDataList(inst.Data);
					lightlist_creater<Object*> llc(v.size());
					for (auto p : v) {
						llc.push_back(p->clone());
					}

					TempResult[ProgramCounter] = new Objects::List(TypeBase::ListType(llc.data()));
					Result = TempResult[ProgramCounter];
					break;
				}
				case pti: {
					Insts::PrintIdent &inst = static_cast<Insts::PrintIdent&>(*Inst);
					for (Element &e : inst.Args) {
						if (e.isIdentType(I_DyVarb))
							print(getIdentName(e), "(");
						Object *op = getObject(e);
						if (op)
							print(getObject(e)->to_string());
						else
							print("Null");
						if (e.isIdentType(I_DyVarb))
							print(")");
						println();
					}
					break;
				}
				case end: {
					return Result;
				}
				}
				ProgramCounter++;
			}
			return Result;
		}